

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# link.hpp
# Opt level: O3

void __thiscall
diy::RegularLink<diy::Bounds<long>_>::RegularLink(RegularLink<diy::Bounds<long>_> *this)

{
  _Rb_tree_header *p_Var1;
  
  (this->super_Registrar<diy::RegularLink<diy::Bounds<long>_>_>).super_Link.neighbors_.
  super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->super_Registrar<diy::RegularLink<diy::Bounds<long>_>_>).super_Link.neighbors_.
  super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->super_Registrar<diy::RegularLink<diy::Bounds<long>_>_>).super_Link.neighbors_.
  super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->super_Registrar<diy::RegularLink<diy::Bounds<long>_>_>).super_Link.super_Factory<diy::Link>
  ._vptr_Factory = (_func_int **)&PTR_id_abi_cxx11__00147a00;
  this->dim_ = 0;
  p_Var1 = &(this->dir_map_)._M_t._M_impl.super__Rb_tree_header;
  (this->dir_map_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->dir_map_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->dir_map_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->dir_map_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->dir_map_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->dir_vec_).super__Vector_base<diy::Direction,_std::allocator<diy::Direction>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->dir_vec_).super__Vector_base<diy::Direction,_std::allocator<diy::Direction>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->dir_vec_).super__Vector_base<diy::Direction,_std::allocator<diy::Direction>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Bounds<long>::Bounds(&this->core_,0);
  Bounds<long>::Bounds(&this->bounds_,0);
  (this->wrap_).super__Vector_base<diy::Direction,_std::allocator<diy::Direction>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->wrap_).super__Vector_base<diy::Direction,_std::allocator<diy::Direction>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->nbr_bounds_).super__Vector_base<diy::Bounds<long>,_std::allocator<diy::Bounds<long>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->nbr_bounds_).super__Vector_base<diy::Bounds<long>,_std::allocator<diy::Bounds<long>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->nbr_cores_).super__Vector_base<diy::Bounds<long>,_std::allocator<diy::Bounds<long>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->nbr_bounds_).super__Vector_base<diy::Bounds<long>,_std::allocator<diy::Bounds<long>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->nbr_cores_).super__Vector_base<diy::Bounds<long>,_std::allocator<diy::Bounds<long>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->nbr_cores_).super__Vector_base<diy::Bounds<long>,_std::allocator<diy::Bounds<long>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->wrap_).super__Vector_base<diy::Direction,_std::allocator<diy::Direction>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return;
}

Assistant:

RegularLink():
                  dim_(0), core_(0), bounds_(0)               {}